

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debug_assert.hpp
# Opt level: O3

void debug_assert::default_handler::handle(source_location *loc,char *expression,char *message)

{
  char *pcVar1;
  ulong uVar2;
  char *__format;
  
  pcVar1 = loc->file_name;
  uVar2 = (ulong)loc->line_number;
  if (*expression == '\0') {
    if (message == (char *)0x0) {
      fprintf(_stderr,"[debug assert] %s:%u: Unreachable code reached.\n",pcVar1,uVar2);
      return;
    }
    __format = "[debug assert] %s:%u: Unreachable code reached - %s.\n";
  }
  else {
    if (message != (char *)0x0) {
      fprintf(_stderr,"[debug assert] %s:%u: Assertion \'%s\' failed - %s.\n",pcVar1,uVar2,
              expression);
      return;
    }
    __format = "[debug assert] %s:%u: Assertion \'%s\' failed.\n";
    message = expression;
  }
  fprintf(_stderr,__format,pcVar1,uVar2,message);
  return;
}

Assistant:

static void handle(const source_location& loc, const char* expression,
                       const char* message = nullptr) noexcept
    {
#ifndef DEBUG_ASSERT_NO_STDIO
        if (*expression == '\0')
        {
            if (message)
                std::fprintf(stderr, "[debug assert] %s:%u: Unreachable code reached - %s.\n",
                             loc.file_name, loc.line_number, message);
            else
                std::fprintf(stderr, "[debug assert] %s:%u: Unreachable code reached.\n",
                             loc.file_name, loc.line_number);
        }
        else if (message)
            std::fprintf(stderr, "[debug assert] %s:%u: Assertion '%s' failed - %s.\n",
                         loc.file_name, loc.line_number, expression, message);
        else
            std::fprintf(stderr, "[debug assert] %s:%u: Assertion '%s' failed.\n", loc.file_name,
                         loc.line_number, expression);
#else
        (void)loc;
        (void)expression;
        (void)message;
#endif
    }